

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newConcurrencyLimitingHttpClient
          (kj *this,HttpClient *inner,uint maxConcurrentRequests,
          Function<void_(unsigned_int,_unsigned_int)> *countChangedCallback)

{
  Function<void_(unsigned_int,_unsigned_int)> *params_2;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar1;
  undefined1 local_38 [24];
  Function<void_(unsigned_int,_unsigned_int)> *countChangedCallback_local;
  HttpClient *pHStack_18;
  uint maxConcurrentRequests_local;
  HttpClient *inner_local;
  
  local_38._16_8_ = countChangedCallback;
  countChangedCallback_local._4_4_ = maxConcurrentRequests;
  pHStack_18 = inner;
  inner_local = (HttpClient *)this;
  params_2 = mv<kj::Function<void(unsigned_int,unsigned_int)>>(countChangedCallback);
  heap<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient,kj::HttpClient&,unsigned_int&,kj::Function<void(unsigned_int,unsigned_int)>>
            ((kj *)local_38,inner,(uint *)((long)&countChangedCallback_local + 4),params_2);
  Own<kj::HttpClient,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient,void>
            ((Own<kj::HttpClient,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient,_std::nullptr_t> *)
             local_38);
  Own<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient,_std::nullptr_t> *)
             local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<HttpClient> newConcurrencyLimitingHttpClient(
    HttpClient& inner, uint maxConcurrentRequests,
    kj::Function<void(uint runningCount, uint pendingCount)> countChangedCallback) {
  return kj::heap<ConcurrencyLimitingHttpClient>(inner, maxConcurrentRequests,
      kj::mv(countChangedCallback));
}